

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# API.cpp
# Opt level: O0

void __thiscall AGSSockAPI::Beacon::~Beacon(Beacon *this)

{
  Beacon *this_local;
  
  close((this->data).fd[0]);
  close((this->data).fd[1]);
  return;
}

Assistant:

Beacon::~Beacon()
{
#ifdef _WIN32
	closesocket(data.fd);
#else
	close(data.fd[0]);
	close(data.fd[1]);
#endif
}